

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# udp_socket.cpp
# Opt level: O2

void __thiscall
libtorrent::aux::udp_socket::wrap
          (udp_socket *this,endpoint *ep,span<const_char> p,error_code *ec,udp_send_flags_t flags)

{
  char *pcVar1;
  element_type *peVar2;
  undefined8 uVar3;
  set_dont_frag df;
  char *h;
  array<char,_255UL> header;
  set_dont_frag local_190;
  char *local_180;
  data_union local_178;
  array<boost::asio::const_buffer,_2UL> local_150;
  char local_12f [255];
  
  local_180 = local_12f;
  write_impl<unsigned_short,int,char*>(0,&local_180);
  *local_180 = '\0';
  pcVar1 = local_180 + 1;
  local_180 = local_180 + 1;
  *pcVar1 = ((ep->impl_).data_.base.sa_family != 2) * '\x03' + '\x01';
  local_180 = local_180 + 1;
  write_endpoint<boost::asio::ip::basic_endpoint<boost::asio::ip::udp>,char*&>(ep,&local_180);
  local_150._M_elems[0].size_ = (long)local_180 - (long)local_12f;
  local_150._M_elems[0].data_ = local_12f;
  local_150._M_elems[1].data_ = p.m_ptr;
  local_150._M_elems[1].size_ = p.m_len;
  set_dont_frag::set_dont_frag
            (&local_190,&this->m_socket,
             (bool)((ep->impl_).data_.base.sa_family == 2 & flags.m_val >> 3));
  peVar2 = (this->m_socks5_connection).
           super___shared_ptr<libtorrent::aux::socks5,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  local_178._0_8_ = *(undefined8 *)&(peVar2->m_udp_proxy_addr).impl_.data_;
  uVar3 = *(undefined8 *)((long)&(peVar2->m_udp_proxy_addr).impl_.data_ + 8);
  local_178._20_8_ = *(undefined8 *)((long)&(peVar2->m_udp_proxy_addr).impl_.data_ + 0x14);
  local_178._16_4_ =
       (undefined4)
       ((ulong)*(undefined8 *)((long)&(peVar2->m_udp_proxy_addr).impl_.data_ + 0xc) >> 0x20);
  local_178._8_4_ = (undefined4)uVar3;
  local_178._12_4_ = (undefined4)((ulong)uVar3 >> 0x20);
  boost::asio::
  basic_datagram_socket<boost::asio::ip::udp,boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context&>,boost::asio::execution::detail::blocking::never_t<0>,boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>>>>
  ::send_to<std::array<boost::asio::const_buffer,2ul>>
            ((basic_datagram_socket<boost::asio::ip::udp,boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context&>,boost::asio::execution::detail::blocking::never_t<0>,boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>>>>
              *)this,&local_150,(endpoint_type *)&local_178.base,0,ec);
  set_dont_frag::~set_dont_frag(&local_190);
  return;
}

Assistant:

void udp_socket::wrap(udp::endpoint const& ep, span<char const> p
	, error_code& ec, udp_send_flags_t const flags)
{
	TORRENT_UNUSED(flags);
	using namespace libtorrent::aux;

	std::array<char, max_header_size> header;
	char* h = header.data();

	write_uint16(0, h); // reserved
	write_uint8(0, h); // fragment
	write_uint8(aux::is_v4(ep) ? 1 : 4, h); // atyp
	write_endpoint(ep, h);

	std::array<boost::asio::const_buffer, 2> iovec;
	iovec[0] = boost::asio::const_buffer(header.data(), aux::numeric_cast<std::size_t>(h - header.data()));
	iovec[1] = boost::asio::const_buffer(p.data(), static_cast<std::size_t>(p.size()));

	// set the DF flag for the socket and clear it again in the destructor
	set_dont_frag df(m_socket, (flags & dont_fragment) && aux::is_v4(ep));

	m_socket.send_to(iovec, m_socks5_connection->target(), 0, ec);
}